

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxvecs.hpp
# Opt level: O2

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::computeFrhsXtra(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *this)

{
  uint *puVar1;
  Status SVar2;
  pointer pnVar3;
  undefined8 uVar4;
  type_conflict5 tVar5;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar6;
  ostream *poVar7;
  SPxInternalCodeException *this_00;
  long lVar8;
  long lVar9;
  allocator local_e9;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e8;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_90;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  
  local_90 = &(this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .low;
  lVar8 = 0x12;
  lVar9 = 0;
  do {
    if ((this->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .set.thenum <= lVar9) {
      return;
    }
    SVar2 = (this->
            super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).thedesc.colstat.data[lVar9];
    if (this->theRep * SVar2 < 1) {
      local_e8.m_backend.fpclass = cpp_dec_float_finite;
      local_e8.m_backend.prec_elem = 0x10;
      local_e8.m_backend.data._M_elems[0] = 0;
      local_e8.m_backend.data._M_elems[1] = 0;
      local_e8.m_backend.data._M_elems[2] = 0;
      local_e8.m_backend.data._M_elems[3] = 0;
      local_e8.m_backend.data._M_elems[0xc] = 0;
      local_e8.m_backend.data._M_elems[0xd] = 0;
      local_e8.m_backend.data._M_elems._56_5_ = 0;
      local_e8.m_backend.data._M_elems[0xf]._1_3_ = 0;
      local_e8.m_backend.exp = 0;
      local_e8.m_backend.neg = false;
      local_e8.m_backend.data._M_elems[4] = 0;
      local_e8.m_backend.data._M_elems[5] = 0;
      local_e8.m_backend.data._M_elems[6] = 0;
      local_e8.m_backend.data._M_elems[7] = 0;
      local_e8.m_backend.data._M_elems[8] = 0;
      local_e8.m_backend.data._M_elems[9] = 0;
      local_e8.m_backend.data._M_elems[10] = 0;
      local_e8.m_backend.data._M_elems[0xb] = 0;
      pVVar6 = &(this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .up;
      switch(SVar2) {
      default:
        poVar7 = std::operator<<((ostream *)&std::cerr,"ESVECS02 ERROR: ");
        poVar7 = std::operator<<(poVar7,"inconsistent basis must not happen!");
        std::endl<char,std::char_traits<char>>(poVar7);
        this_00 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string
                  ((string *)&result,"XSVECS02 This should never happen.",&local_e9);
        SPxInternalCodeException::SPxInternalCodeException(this_00,(string *)&result);
        __cxa_throw(this_00,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
      case P_ON_LOWER:
        pVVar6 = local_90;
      case P_FIXED:
      case P_ON_UPPER:
        pnVar3 = (pVVar6->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar1 = (uint *)((long)&(pnVar3->m_backend).data + lVar8 * 4 + -0x48);
        local_e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar1;
        local_e8.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&(pnVar3->m_backend).data + lVar8 * 4 + -0x38);
        local_e8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        local_e8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&(pnVar3->m_backend).data + lVar8 * 4 + -0x28);
        local_e8.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar1;
        local_e8.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&(pnVar3->m_backend).data + lVar8 * 4 + -0x18);
        local_e8.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar1;
        uVar4 = *(undefined8 *)(puVar1 + 2);
        local_e8.m_backend.data._M_elems._56_5_ = SUB85(uVar4,0);
        local_e8.m_backend.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
        local_e8.m_backend.exp = *(int *)((long)&(pnVar3->m_backend).data + lVar8 * 4 + -8);
        local_e8.m_backend.neg = *(bool *)((long)&(pnVar3->m_backend).data + lVar8 * 4 + -4);
        local_e8.m_backend._72_8_ = *(undefined8 *)((long)&(pnVar3->m_backend).data + lVar8 * 4);
        result.m_backend.data._M_elems[0] = 0;
        result.m_backend.data._M_elems[1] = 0;
        tVar5 = boost::multiprecision::operator!=(&local_e8,(double *)&result);
        if (tVar5) {
          result.m_backend.data._M_elems[0xf]._1_3_ = local_e8.m_backend.data._M_elems[0xf]._1_3_;
          result.m_backend.data._M_elems._56_5_ = local_e8.m_backend.data._M_elems._56_5_;
          result.m_backend.data._M_elems[0] = local_e8.m_backend.data._M_elems[0];
          result.m_backend.data._M_elems[1] = local_e8.m_backend.data._M_elems[1];
          uVar4 = result.m_backend.data._M_elems._0_8_;
          result.m_backend.data._M_elems[2] = local_e8.m_backend.data._M_elems[2];
          result.m_backend.data._M_elems[3] = local_e8.m_backend.data._M_elems[3];
          result.m_backend.data._M_elems[0xc] = local_e8.m_backend.data._M_elems[0xc];
          result.m_backend.data._M_elems[0xd] = local_e8.m_backend.data._M_elems[0xd];
          result.m_backend.data._M_elems[8] = local_e8.m_backend.data._M_elems[8];
          result.m_backend.data._M_elems[9] = local_e8.m_backend.data._M_elems[9];
          result.m_backend.data._M_elems[10] = local_e8.m_backend.data._M_elems[10];
          result.m_backend.data._M_elems[0xb] = local_e8.m_backend.data._M_elems[0xb];
          result.m_backend.data._M_elems[4] = local_e8.m_backend.data._M_elems[4];
          result.m_backend.data._M_elems[5] = local_e8.m_backend.data._M_elems[5];
          result.m_backend.data._M_elems[6] = local_e8.m_backend.data._M_elems[6];
          result.m_backend.data._M_elems[7] = local_e8.m_backend.data._M_elems[7];
          result.m_backend.exp = local_e8.m_backend.exp;
          result.m_backend.neg = local_e8.m_backend.neg;
          result.m_backend.fpclass = local_e8.m_backend.fpclass;
          result.m_backend.prec_elem = local_e8.m_backend.prec_elem;
          result.m_backend.data._M_elems[0] = local_e8.m_backend.data._M_elems[0];
          if (local_e8.m_backend.fpclass != cpp_dec_float_finite ||
              result.m_backend.data._M_elems[0] != 0) {
            result.m_backend.neg = (bool)(local_e8.m_backend.neg ^ 1);
          }
          result.m_backend.data._M_elems._0_8_ = uVar4;
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
          ::
          multAdd<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    ((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      *)this->theFrhs,&result,
                     (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)((this->thevectors->set).theitem + (this->thevectors->set).thekey[lVar9].idx
                        ));
        }
        break;
      case P_FREE:
        break;
      }
    }
    lVar9 = lVar9 + 1;
    lVar8 = lVar8 + 0x14;
  } while( true );
}

Assistant:

void SPxSolverBase<R>::computeFrhsXtra()
{

   assert(rep()  == COLUMN);
   assert(type() == LEAVE);

   for(int i = 0; i < this->nCols(); ++i)
   {
      typename SPxBasisBase<R>::Desc::Status stat = this->desc().colStatus(i);

      if(!isBasic(stat))
      {
         R x;

         // coverity[switch_selector_expr_is_constant]
         switch(stat)
         {
         // columnwise cases:
         case SPxBasisBase<R>::Desc::P_FREE :
            continue;

         case(SPxBasisBase<R>::Desc::P_FIXED) :
            assert(EQ(SPxLPBase<R>::lower(i), SPxLPBase<R>::upper(i), this->epsilon()));

         //lint -fallthrough
         case SPxBasisBase<R>::Desc::P_ON_UPPER :
            x = SPxLPBase<R>::upper(i);
            break;

         case SPxBasisBase<R>::Desc::P_ON_LOWER :
            x = SPxLPBase<R>::lower(i);
            break;

         default:
            SPX_MSG_ERROR(std::cerr << "ESVECS02 ERROR: "
                          << "inconsistent basis must not happen!"
                          << std::endl;)
            throw SPxInternalCodeException("XSVECS02 This should never happen.");
         }

         assert(x < R(infinity));
         assert(x > R(-infinity));

         if(x != 0.0)
            theFrhs->multAdd(-x, vector(i));
      }
   }
}